

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrIncr.c
# Opt level: O0

int IPdr_ManCheckCubeReduce(Pdr_Man_t *p,Vec_Ptr_t *vClauses,Pdr_Set_t *pCube,int nConfLimit)

{
  Vec_Int_t *pVVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Aig_Obj_t *pObj;
  int *piVar6;
  int *piVar7;
  abctime aVar8;
  Vec_Ptr_t *pVVar9;
  Vec_Bit_t *p_00;
  Vec_Bit_t *vMark;
  Vec_Ptr_t *vTemp;
  int *pcorelits;
  abctime aStack_70;
  int ncorelits;
  abctime clk;
  Pdr_Set_t *pPStack_60;
  int iActVar;
  Pdr_Set_t *pCla;
  int local_50;
  int i;
  int RetValue;
  int Lit;
  Vec_Int_t *vLitsA;
  Vec_Int_t *vLits;
  sat_solver *pSat;
  Pdr_Set_t *pPStack_28;
  int nConfLimit_local;
  Pdr_Set_t *pCube_local;
  Vec_Ptr_t *vClauses_local;
  Pdr_Man_t *p_local;
  
  local_50 = 1;
  clk._4_4_ = 0;
  pSat._4_4_ = nConfLimit;
  pPStack_28 = pCube;
  pCube_local = (Pdr_Set_t *)vClauses;
  vClauses_local = (Vec_Ptr_t *)p;
  aStack_70 = Abc_Clock();
  vLits = (Vec_Int_t *)Pdr_ManSolver((Pdr_Man_t *)vClauses_local,1);
  pVVar9 = vClauses_local;
  if (pPStack_28 == (Pdr_Set_t *)0x0) {
    pObj = Aig_ManCo((Aig_Man_t *)vClauses_local->pArray,*(int *)&vClauses_local[5].pArray);
    iVar2 = Pdr_ObjSatVar((Pdr_Man_t *)pVVar9,1,2,pObj);
    i = Abc_Var2Lit(iVar2,0);
    local_50 = sat_solver_addclause((sat_solver *)vLits,&i,&RetValue);
    if (local_50 != 1) {
      __assert_fail("RetValue == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                    ,0x385,"int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)"
                   );
    }
    iVar2 = Vec_PtrSize((Vec_Ptr_t *)pCube_local);
    _RetValue = Vec_IntStart(iVar2);
    clk._4_4_ = Pdr_ManFreeVar((Pdr_Man_t *)vClauses_local,1);
    for (pCla._4_4_ = 1; iVar2 = pCla._4_4_, iVar3 = Vec_PtrSize((Vec_Ptr_t *)pCube_local),
        iVar2 < iVar3; pCla._4_4_ = pCla._4_4_ + 1) {
      Pdr_ManFreeVar((Pdr_Man_t *)vClauses_local,1);
    }
    for (pCla._4_4_ = 0; iVar2 = pCla._4_4_, iVar3 = Vec_PtrSize((Vec_Ptr_t *)pCube_local),
        iVar2 < iVar3; pCla._4_4_ = pCla._4_4_ + 1) {
      pPStack_60 = (Pdr_Set_t *)Vec_PtrEntry((Vec_Ptr_t *)pCube_local,pCla._4_4_);
      vLitsA = Pdr_ManCubeToLits((Pdr_Man_t *)vClauses_local,1,pPStack_60,1,0);
      i = Abc_Var2Lit(clk._4_4_ + pCla._4_4_,1);
      Vec_IntPush(vLitsA,i);
      pVVar1 = vLits;
      piVar6 = Vec_IntArray(vLitsA);
      piVar7 = Vec_IntArray(vLitsA);
      iVar2 = Vec_IntSize(vLitsA);
      local_50 = sat_solver_addclause((sat_solver *)pVVar1,piVar6,piVar7 + iVar2);
      pVVar1 = _RetValue;
      iVar2 = pCla._4_4_;
      if (local_50 != 1) {
        __assert_fail("RetValue == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                      ,0x392,
                      "int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)");
      }
      iVar3 = Abc_Var2Lit(clk._4_4_ + pCla._4_4_,0);
      Vec_IntWriteEntry(pVVar1,iVar2,iVar3);
    }
    sat_solver_compress((sat_solver *)vLits);
    pVVar1 = vLits;
    piVar6 = Vec_IntArray(_RetValue);
    piVar7 = Vec_IntArray(_RetValue);
    iVar2 = Vec_IntSize(_RetValue);
    local_50 = sat_solver_solve((sat_solver *)pVVar1,piVar6,piVar7 + iVar2,(long)pSat._4_4_,0,0,0);
    Vec_IntFree(_RetValue);
    if (local_50 == 0) {
      return -1;
    }
  }
  if (local_50 != 0) {
    if (local_50 == -1) {
      uVar4 = sat_solver_final((sat_solver *)vLits,(int **)&vTemp);
      pcorelits._4_4_ = uVar4;
      uVar5 = Vec_PtrSize((Vec_Ptr_t *)pCube_local);
      Abc_Print(1,"UNSAT at the last frame. nCores = %d (out of %d).",(ulong)uVar4,(ulong)uVar5);
      aVar8 = Abc_Clock();
      Abc_PrintTime(1,"    Time",aVar8 - aStack_70);
      pVVar9 = Vec_PtrDup((Vec_Ptr_t *)pCube_local);
      iVar2 = Vec_PtrSize((Vec_Ptr_t *)pCube_local);
      p_00 = Vec_BitStart(iVar2);
      Vec_PtrClear((Vec_Ptr_t *)pCube_local);
      for (pCla._4_4_ = 0; pCla._4_4_ < (int)pcorelits._4_4_; pCla._4_4_ = pCla._4_4_ + 1) {
        iVar2 = Abc_Lit2Var((&vTemp->nCap)[pCla._4_4_]);
        Vec_BitWriteEntry(p_00,iVar2 - clk._4_4_,1);
      }
      for (pCla._4_4_ = 0; iVar2 = pCla._4_4_, iVar3 = Vec_PtrSize(pVVar9), iVar2 < iVar3;
          pCla._4_4_ = pCla._4_4_ + 1) {
        pPStack_60 = (Pdr_Set_t *)Vec_PtrEntry(pVVar9,pCla._4_4_);
        iVar2 = Vec_BitEntry(p_00,pCla._4_4_);
        if (iVar2 == 0) {
          Pdr_SetDeref(pPStack_60);
        }
        else {
          Vec_PtrPush((Vec_Ptr_t *)pCube_local,pPStack_60);
        }
      }
      Vec_PtrFree(pVVar9);
      Vec_BitFree(p_00);
      local_50 = 1;
    }
    else {
      Abc_Print(1,"SAT at the last frame.");
      aVar8 = Abc_Clock();
      Abc_PrintTime(1,"    Time",aVar8 - aStack_70);
      local_50 = 0;
    }
    return local_50;
  }
  __assert_fail("RetValue != l_Undef",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrIncr.c"
                ,0x39f,"int IPdr_ManCheckCubeReduce(Pdr_Man_t *, Vec_Ptr_t *, Pdr_Set_t *, int)");
}

Assistant:

int IPdr_ManCheckCubeReduce( Pdr_Man_t * p, Vec_Ptr_t * vClauses, Pdr_Set_t * pCube, int nConfLimit )
{ 
    sat_solver * pSat;
    Vec_Int_t * vLits, * vLitsA;
    int Lit, RetValue = l_True;
    int i;
    Pdr_Set_t * pCla;
    int iActVar = 0;
    abctime clk = Abc_Clock();

    pSat = Pdr_ManSolver( p, 1 );

    if ( pCube == NULL ) // solve the property
    {
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p, 1, 2, Aig_ManCo(p->pAig, p->iOutCur)), 0 ); // pos literal (property fails)
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit+1 );
        assert( RetValue == 1 );

        vLitsA = Vec_IntStart( Vec_PtrSize( vClauses ) );
        iActVar = Pdr_ManFreeVar( p, 1 );
        for ( i = 1; i < Vec_PtrSize( vClauses ); ++i )
            Pdr_ManFreeVar( p, 1 );
        Vec_PtrForEachEntry( Pdr_Set_t *, vClauses, pCla, i )
        {
            vLits = Pdr_ManCubeToLits( p, 1, pCla, 1, 0 );
            Lit = Abc_Var2Lit( iActVar + i, 1 );
            Vec_IntPush( vLits, Lit );

            RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
            assert( RetValue == 1 );
            Vec_IntWriteEntry( vLitsA, i, Abc_Var2Lit( iActVar + i, 0 )  );
        }
        sat_solver_compress( pSat );

        // solve 
        RetValue = sat_solver_solve( pSat, Vec_IntArray(vLitsA), Vec_IntArray(vLitsA) + Vec_IntSize(vLitsA), nConfLimit, 0, 0, 0 );
        Vec_IntFree( vLitsA );

        if ( RetValue == l_Undef )
            return -1;
    }

    assert( RetValue != l_Undef );
    if ( RetValue == l_False ) // UNSAT
    {
        int ncorelits, *pcorelits;
        Vec_Ptr_t * vTemp = NULL;
        Vec_Bit_t * vMark = NULL;

        ncorelits = sat_solver_final(pSat, &pcorelits);
        Abc_Print( 1, "UNSAT at the last frame. nCores = %d (out of %d).", ncorelits, Vec_PtrSize( vClauses ) );
        Abc_PrintTime( 1, "    Time", Abc_Clock() - clk );

        vTemp = Vec_PtrDup( vClauses );
        vMark = Vec_BitStart( Vec_PtrSize( vClauses) );
        Vec_PtrClear( vClauses );
        for ( i = 0; i < ncorelits; ++i )
        {
            //Abc_Print( 1, "Core[%d] = lit(%d) = var(%d) = %d-th set\n", i, pcorelits[i], Abc_Lit2Var(pcorelits[i]), Abc_Lit2Var(pcorelits[i]) - iActVar );
            Vec_BitWriteEntry( vMark, Abc_Lit2Var( pcorelits[i] ) - iActVar, 1 );
        }
        
        Vec_PtrForEachEntry( Pdr_Set_t *, vTemp, pCla, i )
        {
            if ( Vec_BitEntry( vMark, i ) )
            { 
                Vec_PtrPush( vClauses, pCla );
                continue;
            }
            Pdr_SetDeref( pCla );
        }

        Vec_PtrFree( vTemp );
        Vec_BitFree( vMark );
        RetValue = 1;
    }
    else // SAT
    {
        Abc_Print( 1, "SAT at the last frame." );
        Abc_PrintTime( 1, "    Time", Abc_Clock() - clk );
        RetValue = 0;
    }

    return RetValue;
}